

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool __thiscall
duckdb::DictionaryCompressionState::UpdateState
          (DictionaryCompressionState *this,Vector *scan_vector,idx_t count)

{
  uint uVar1;
  BlockManager *pBVar2;
  int iVar3;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  InternalException *this_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  UnifiedVectorFormat vdata;
  string local_98;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(scan_vector,count,&local_78);
  (*(this->super_CompressionState)._vptr_CompressionState[2])(this);
  if (count == 0) {
    bVar12 = true;
  }
  else {
    bVar12 = false;
    uVar7 = 0;
    do {
      uVar11 = uVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)(local_78.sel)->sel_vector[uVar7];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar11 >> 6]
           >> (uVar11 & 0x3f) & 1) != 0)) {
        uVar1 = *(uint *)(local_78.data + uVar11 * 0x10);
        uVar8 = (ulong)uVar1;
        pBVar2 = (this->super_CompressionState).info.block_manager;
        iVar4 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
        iVar5 = optional_idx::GetIndex(&pBVar2->block_header_size);
        uVar9 = iVar4 - iVar5 >> 2 & 0xfffffffffffffff8;
        if (0xfff < uVar9) {
          uVar9 = 0x1000;
        }
        if ((uint)uVar9 <= uVar1) break;
        iVar3 = (*(this->super_CompressionState)._vptr_CompressionState[3])
                          (this,*(undefined8 *)(local_78.data + uVar11 * 0x10),
                           *(undefined8 *)(local_78.data + uVar11 * 0x10 + 8));
        bVar10 = (byte)iVar3 ^ 1;
        bVar12 = true;
      }
      else {
        bVar12 = false;
        uVar8 = 0;
        bVar10 = 0;
      }
      iVar3 = (*(this->super_CompressionState)._vptr_CompressionState[7])(this,(ulong)bVar10,uVar8);
      if ((char)iVar3 == '\0') {
        (*(this->super_CompressionState)._vptr_CompressionState[8])(this,0);
        iVar3 = (*(this->super_CompressionState)._vptr_CompressionState[7])(this,1,uVar8);
        bVar10 = 1;
        if ((char)iVar3 == '\0') {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Dictionary compression could not write to new segment","")
          ;
          InternalException::InternalException(this_00,&local_98);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      lVar6 = 0x30;
      if ((bVar12) && (lVar6 = 0x20, bVar10 != 0)) {
        (*(this->super_CompressionState)._vptr_CompressionState[5])
                  (this,*(undefined8 *)(local_78.data + uVar11 * 0x10),
                   *(undefined8 *)(local_78.data + uVar11 * 0x10 + 8));
      }
      else {
        (**(code **)((long)(this->super_CompressionState)._vptr_CompressionState + lVar6))(this);
      }
      (*(this->super_CompressionState)._vptr_CompressionState[2])(this);
      uVar7 = uVar7 + 1;
      bVar12 = count <= uVar7;
    } while (uVar7 != count);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar12;
}

Assistant:

bool DictionaryCompressionState::UpdateState(Vector &scan_vector, idx_t count) {
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	Verify();

	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		idx_t string_size = 0;
		bool new_string = false;
		auto row_is_valid = vdata.validity.RowIsValid(idx);

		if (row_is_valid) {
			string_size = data[idx].GetSize();
			if (string_size >= StringUncompressed::GetStringBlockLimit(info.GetBlockSize())) {
				// Big strings not implemented for dictionary compression
				return false;
			}
			new_string = !LookupString(data[idx]);
		}

		bool fits = CalculateSpaceRequirements(new_string, string_size);
		if (!fits) {
			Flush();
			new_string = true;

			fits = CalculateSpaceRequirements(new_string, string_size);
			if (!fits) {
				throw InternalException("Dictionary compression could not write to new segment");
			}
		}

		if (!row_is_valid) {
			AddNull();
		} else if (new_string) {
			AddNewString(data[idx]);
		} else {
			AddLastLookup();
		}

		Verify();
	}

	return true;
}